

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O2

gpointer g_hash_table_find(GHashTable *hash_table,GHRFunc predicate,gpointer user_data)

{
  GHashNode *pGVar1;
  gboolean gVar2;
  long lVar3;
  long lVar4;
  
  if (predicate == (GHRFunc)0x0 || hash_table == (GHashTable *)0x0) {
    return (gpointer)0x0;
  }
  lVar4 = 0x10;
  lVar3 = 0;
  while( true ) {
    if (hash_table->size <= lVar3) {
      return (gpointer)0x0;
    }
    pGVar1 = hash_table->nodes;
    if ((1 < *(uint *)((long)&pGVar1->key + lVar4)) &&
       (gVar2 = (*predicate)(*(gpointer *)((long)pGVar1 + lVar4 + -0x10),
                             *(gpointer *)((long)pGVar1 + lVar4 + -8),user_data), gVar2 != 0))
    break;
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x18;
  }
  return *(gpointer *)((long)pGVar1 + lVar4 + -8);
}

Assistant:

gpointer g_hash_table_find (GHashTable      *hash_table,
        GHRFunc          predicate,
        gpointer         user_data)
{
    gint i;

    if (hash_table == NULL) return NULL;
    if (predicate == NULL) return NULL;

    for (i = 0; i < hash_table->size; i++)
    {
        GHashNode *node = &hash_table->nodes [i];

        if (node->key_hash > 1 && predicate (node->key, node->value, user_data))
            return node->value;
    }

    return NULL;
}